

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O1

bool __thiscall
BlockFilterIndex::LookupFilterRange
          (BlockFilterIndex *this,int start_height,CBlockIndex *stop_index,
          vector<BlockFilter,_std::allocator<BlockFilter>_> *filters_out)

{
  pointer pDVar1;
  bool bVar2;
  bool bVar3;
  DBVal *entry;
  pointer hash;
  pointer filter;
  long in_FS_OFFSET;
  vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_> entries;
  vector<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.
  super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = LookupRange(&((this->m_db)._M_t.
                        super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                        .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                       super_CDBWrapper,&(this->super_BaseIndex).m_name,start_height,stop_index,
                      &local_48);
  pDVar1 = local_48.
           super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  hash = local_48.
         super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if (bVar2) {
    std::vector<BlockFilter,_std::allocator<BlockFilter>_>::resize
              (filters_out,
               ((long)local_48.
                      super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.
                      super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
    bVar2 = hash == pDVar1;
    if (!bVar2) {
      filter = (filters_out->super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        bVar3 = ReadFilterFromDisk(this,&hash->pos,&hash->hash,filter);
        if (!bVar3) break;
        filter = filter + 1;
        hash = hash + 1;
        bVar2 = hash == pDVar1;
      } while (!bVar2);
    }
  }
  else {
    bVar2 = false;
  }
  if (local_48.
      super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<(anonymous_namespace)::DBVal,_std::allocator<(anonymous_namespace)::DBVal>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool BlockFilterIndex::LookupFilterRange(int start_height, const CBlockIndex* stop_index,
                                         std::vector<BlockFilter>& filters_out) const
{
    std::vector<DBVal> entries;
    if (!LookupRange(*m_db, m_name, start_height, stop_index, entries)) {
        return false;
    }

    filters_out.resize(entries.size());
    auto filter_pos_it = filters_out.begin();
    for (const auto& entry : entries) {
        if (!ReadFilterFromDisk(entry.pos, entry.hash, *filter_pos_it)) {
            return false;
        }
        ++filter_pos_it;
    }

    return true;
}